

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eth_linux.c
# Opt level: O0

void * csp_eth_rx_loop(void *param)

{
  int *in_RDI;
  csp_eth_header_t *unaff_retaddr;
  csp_iface_t *in_stack_00000008;
  uint32_t received_len;
  csp_eth_header_t *eth_frame;
  eth_context_t *ctx;
  int *piVar1;
  
  piVar1 = in_RDI;
  do {
    recvfrom(in_RDI[0x26],csp_eth_rx_loop::recvbuf,3000,0,(sockaddr *)0x0,(socklen_t *)0x0);
    csp_eth_rx(in_stack_00000008,unaff_retaddr,(uint32_t)((ulong)piVar1 >> 0x20),in_RDI);
  } while( true );
}

Assistant:

void * csp_eth_rx_loop(void * param) {

    eth_context_t * ctx = param;

    static uint8_t recvbuf[CSP_ETH_BUF_SIZE];
    csp_eth_header_t * eth_frame = (csp_eth_header_t *)recvbuf;

    while(1) {

        /* Receive packet segment */ 

        uint32_t received_len = recvfrom(ctx->sockfd, recvbuf, CSP_ETH_BUF_SIZE, 0, NULL, NULL);

        csp_eth_rx(&ctx->ifdata.iface, eth_frame, received_len, NULL);
    }

    return NULL;
}